

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void * lzma_alloc(size_t size,lzma_allocator *allocator)

{
  void *pvVar1;
  size_t __size;
  
  __size = size + (size == 0);
  if ((allocator != (lzma_allocator *)0x0) &&
     (allocator->alloc != (_func_void_ptr_void_ptr_size_t_size_t *)0x0)) {
    pvVar1 = (*allocator->alloc)(allocator->opaque,1,__size);
    return pvVar1;
  }
  pvVar1 = malloc(__size);
  return pvVar1;
}

Assistant:

extern void * lzma_attribute((__malloc__)) lzma_attr_alloc_size(1)
lzma_alloc(size_t size, lzma_allocator *allocator)
{
	void *ptr;

	// Some malloc() variants return NULL if called with size == 0.
	if (size == 0)
		size = 1;

	if (allocator != NULL && allocator->alloc != NULL)
		ptr = allocator->alloc(allocator->opaque, 1, size);
	else
		ptr = malloc(size);

	return ptr;
}